

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_nop_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char *pcVar1;
  size_t insize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  char *pcStack_20;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  pcVar1 = (char *)((part->encstate).bufend - (part->encstate).bufbeg);
  if (size == 0) {
    buffer_local = (char *)0xfffffffffffffffe;
  }
  else {
    pcStack_20 = (char *)size;
    if (pcVar1 < size) {
      pcStack_20 = pcVar1;
    }
    if (pcStack_20 != (char *)0x0) {
      memcpy(buffer,(part->encstate).buf + (part->encstate).bufbeg,(size_t)pcStack_20);
    }
    (part->encstate).bufbeg = (size_t)(pcStack_20 + (part->encstate).bufbeg);
    buffer_local = pcStack_20;
  }
  return (size_t)buffer_local;
}

Assistant:

static size_t encoder_nop_read(char *buffer, size_t size, bool ateof,
                               struct curl_mimepart *part)
{
  struct mime_encoder_state *st = &part->encstate;
  size_t insize = st->bufend - st->bufbeg;

  (void) ateof;

  if(!size)
    return STOP_FILLING;

  if(size > insize)
    size = insize;

  if(size)
    memcpy(buffer, st->buf + st->bufbeg, size);

  st->bufbeg += size;
  return size;
}